

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  undefined8 uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  watcher_list *w_00;
  uv__queue *q_00;
  bool bVar5;
  char *local_1078;
  undefined1 local_1068 [8];
  char buf [4096];
  char *p;
  ssize_t size;
  char *path;
  uv__queue *q;
  uv__queue queue;
  uv_fs_event_t *h;
  watcher_list *w;
  inotify_event *e;
  uint events_local;
  uv__io_t *dummy_local;
  uv_loop_t *loop_local;
  
  while( true ) {
    do {
      sVar3 = read(loop->inotify_fd,local_1068,0x1000);
      bVar5 = false;
      if (sVar3 == -1) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if (sVar3 == -1) break;
    if (sVar3 < 1) {
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                    ,0x978,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    for (buf._4088_8_ = local_1068; uVar1 = buf._4088_8_, (ulong)buf._4088_8_ < local_1068 + sVar3;
        buf._4088_8_ = (ulong)*(uint *)(uVar1 + 0xc) + 0x10 + buf._4088_8_) {
      e._4_4_ = 0;
      if ((*(uint *)(buf._4088_8_ + 4) & 6) != 0) {
        e._4_4_ = 2;
      }
      if ((*(uint *)(buf._4088_8_ + 4) & 0xfffffff9) != 0) {
        e._4_4_ = e._4_4_ | 1;
      }
      w_00 = find_watcher(loop,*(int *)buf._4088_8_);
      if (w_00 != (watcher_list *)0x0) {
        if (*(int *)(uVar1 + 0xc) == 0) {
          local_1078 = uv__basename_r(w_00->path);
        }
        else {
          local_1078 = (char *)(uVar1 + 0x10);
        }
        w_00->iterating = 1;
        uv__queue_move(&w_00->watchers,(uv__queue *)&q);
        while (iVar2 = uv__queue_empty((uv__queue *)&q), iVar2 == 0) {
          q_00 = uv__queue_head((uv__queue *)&q);
          queue.prev = q_00 + -7;
          uv__queue_remove(q_00);
          uv__queue_insert_tail(&w_00->watchers,q_00);
          (*(code *)queue.prev[6].prev)(queue.prev,local_1078,e._4_4_,0);
        }
        w_00->iterating = 0;
        maybe_free_watcher_list(w_00,loop);
      }
    }
  }
  piVar4 = __errno_location();
  if ((*piVar4 != 0xb) && (piVar4 = __errno_location(), *piVar4 != 0xb)) {
    __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/mattn[P]http-server/deps/libuv/src/unix/linux.c"
                  ,0x974,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  return;
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  struct uv__queue queue;
  struct uv__queue* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  for (;;) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct inotify_event*) p;

      events = 0;
      if (e->mask & (IN_ATTRIB|IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(IN_ATTRIB|IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use uv__queue_move() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      uv__queue_move(&w->watchers, &queue);
      while (!uv__queue_empty(&queue)) {
        q = uv__queue_head(&queue);
        h = uv__queue_data(q, uv_fs_event_t, watchers);

        uv__queue_remove(q);
        uv__queue_insert_tail(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}